

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O2

bool all_tensors_in_other(gguf_context *ctx,gguf_context *other)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *__s;
  long lVar5;
  long lVar6;
  ulong uVar7;
  string name;
  allocator<char> local_59;
  ulong local_58;
  undefined8 local_50 [4];
  
  uVar2 = gguf_get_n_tensors();
  uVar7 = 0;
  local_58 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    local_58 = uVar7;
  }
  bVar1 = true;
  for (; local_58 != uVar7; uVar7 = uVar7 + 1) {
    __s = (char *)gguf_get_tensor_name(ctx,uVar7);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_59);
    uVar2 = gguf_find_tensor(other,local_50[0]);
    if ((uVar7 == uVar2) || (bVar1 = false, -1 < (int)uVar2)) {
      iVar3 = gguf_get_tensor_type(ctx,uVar7);
      iVar4 = gguf_get_tensor_type(other,uVar7);
      lVar5 = gguf_get_tensor_offset(ctx,uVar7);
      lVar6 = gguf_get_tensor_offset(other,uVar7);
      bVar1 = (bool)((lVar5 == lVar6 && iVar3 == iVar4) & bVar1);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return bVar1;
}

Assistant:

static bool all_tensors_in_other(const gguf_context * ctx, const gguf_context * other) {
    bool ok = true;

    const int n_tensors = gguf_get_n_tensors(ctx);
    for (int id = 0; id < n_tensors; ++id) {
        const std::string name = gguf_get_tensor_name(ctx, id);

        const int idx_other = gguf_find_tensor(other, name.c_str());
        if (id != idx_other) {
            ok = false;
            if (idx_other < 0) {
                continue;
            }
        }

        const ggml_type type = gguf_get_tensor_type(ctx, id);
        if (type != gguf_get_tensor_type(other, id)) {
            ok = false;
        }

        const size_t offset = gguf_get_tensor_offset(ctx, id);
        if (offset != gguf_get_tensor_offset(other, id)) {
            ok = false;
        }
    }

    return ok;
}